

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uprops.cpp
# Opt level: O0

UBool u_hasBinaryProperty_63(UChar32 c,UProperty which)

{
  BinaryProperty *prop;
  UProperty which_local;
  UChar32 c_local;
  
  if ((which < UCHAR_ALPHABETIC) || (UCHAR_EXTENDED_PICTOGRAPHIC < which)) {
    which_local._3_1_ = UCHAR_ALPHABETIC >> 0x18;
  }
  else {
    which_local._3_1_ = (*binProps[which].contains)(binProps + which,c,which);
  }
  return which_local._3_1_;
}

Assistant:

U_CAPI UBool U_EXPORT2
u_hasBinaryProperty(UChar32 c, UProperty which) {
    /* c is range-checked in the functions that are called from here */
    if(which<UCHAR_BINARY_START || UCHAR_BINARY_LIMIT<=which) {
        /* not a known binary property */
        return FALSE;
    } else {
        const BinaryProperty &prop=binProps[which];
        return prop.contains(prop, c, which);
    }
}